

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

MatcherDescriberInterface *
testing::internal::MatcherBase<n_e_s::core::INesController::Button>::
GetDescriberImpl<testing::internal::MatcherBase<n_e_s::core::INesController::Button>::ValuePolicy<testing::internal::EqMatcher<n_e_s::core::INesController::Button>,true>>
          (MatcherBase<n_e_s::core::INesController::Button> *m)

{
  __tuple_element_t<0UL,_tuple<const_MatcherBase<Button>_*,_const_EqMatcher<Button>_*>_> *ppMVar1;
  MatcherBase<n_e_s::core::INesController::Button> *local_28;
  tuple<const_testing::internal::MatcherBase<n_e_s::core::INesController::Button>_*,_const_testing::internal::EqMatcher<n_e_s::core::INesController::Button>_*>
  local_20;
  MatcherBase<n_e_s::core::INesController::Button> *local_10;
  MatcherBase<n_e_s::core::INesController::Button> *m_local;
  
  local_28 = m;
  local_10 = m;
  ValuePolicy<testing::internal::EqMatcher<n_e_s::core::INesController::Button>,_true>::Get(m);
  std::
  make_tuple<testing::internal::MatcherBase<n_e_s::core::INesController::Button>const*,testing::internal::EqMatcher<n_e_s::core::INesController::Button>const*>
            ((MatcherBase<n_e_s::core::INesController::Button> **)&local_20,
             (EqMatcher<n_e_s::core::INesController::Button> **)&local_28);
  ppMVar1 = std::
            get<0ul,testing::internal::MatcherBase<n_e_s::core::INesController::Button>const*,testing::internal::EqMatcher<n_e_s::core::INesController::Button>const*>
                      (&local_20);
  return &(*ppMVar1)->super_MatcherDescriberInterface;
}

Assistant:

static const MatcherDescriberInterface* GetDescriberImpl(
      const MatcherBase& m) {
    // If the impl is a MatcherDescriberInterface, then return it.
    // Otherwise use MatcherBase itself.
    // This allows us to implement the GetDescriber() function without support
    // from the impl, but some users really want to get their impl back when
    // they call GetDescriber().
    // We use std::get on a tuple as a workaround of not having `if constexpr`.
    return std::get<(
        std::is_convertible<decltype(&P::Get(m)),
                            const MatcherDescriberInterface*>::value
            ? 1
            : 0)>(std::make_tuple(&m, &P::Get(m)));
  }